

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

bool __thiscall EventLoop::updateSocket(EventLoop *this,int fd,uint mode)

{
  uint uVar1;
  FILE *__stream;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  pointer ppVar5;
  int *piVar6;
  uint *puVar7;
  char *pcVar8;
  String local_80;
  undefined1 local_5c [8];
  epoll_event ev;
  int e;
  _Self local_30;
  iterator socket;
  lock_guard<std::mutex> locker;
  uint mode_local;
  int fd_local;
  EventLoop *this_local;
  
  locker._M_device._0_4_ = mode;
  locker._M_device._4_4_ = fd;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&socket,&this->mMutex);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
       ::find(&this->mSockets,(key_type_conflict *)((long)&locker._M_device + 4));
  _e = std::
       map<int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
       ::end(&this->mSockets);
  bVar4 = std::operator==(&local_30,(_Self *)&e);
  uVar2 = (uint)locker._M_device;
  if (bVar4) {
    fprintf(_stderr,"Unable to find socket to update %d\n",(ulong)locker._M_device._4_4_);
    this_local._7_1_ = false;
  }
  else {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>
             ::operator->(&local_30);
    (ppVar5->second).first = uVar2;
    memset(local_5c,0,0xc);
    local_5c._0_4_ = 0x2000;
    if (((uint)locker._M_device & 0x10) == 0) {
      local_5c._0_4_ = 0x80002000;
    }
    if (((uint)locker._M_device & 1) != 0) {
      local_5c._0_4_ = local_5c._0_4_ | 1;
    }
    if (((uint)locker._M_device & 2) != 0) {
      local_5c._0_4_ = local_5c._0_4_ | 4;
    }
    if (((uint)locker._M_device & 4) != 0) {
      local_5c._0_4_ = local_5c._0_4_ | 0x40000000;
    }
    local_5c._4_4_ = locker._M_device._4_4_;
    ev.data.fd = epoll_ctl(this->mPollFd,3,locker._M_device._4_4_,(epoll_event *)local_5c);
    if (((ev.data.fd == -1) && (piVar6 = __errno_location(), *piVar6 != 0x11)) &&
       (piVar6 = __errno_location(), uVar3 = locker._M_device._4_4_, uVar2 = (uint)locker._M_device,
       __stream = _stderr, *piVar6 != 2)) {
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      piVar6 = __errno_location();
      Rct::strerror((Rct *)&local_80,*piVar6);
      pcVar8 = String::constData(&local_80);
      fprintf(__stream,"Unable to register socket %d with mode %x: %d (%s)\n",(ulong)uVar3,
              (ulong)uVar2,(ulong)uVar1,pcVar8);
      String::~String(&local_80);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  ev.data.u64._4_4_ = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&socket);
  return this_local._7_1_;
}

Assistant:

bool EventLoop::updateSocket(int fd, unsigned int mode)
{
    std::lock_guard<std::mutex> locker(mMutex);
    auto socket = mSockets.find(fd);
    if (socket == mSockets.end()) {
        fprintf(stderr, "Unable to find socket to update %d\n", fd);
        return false;
    }
#if defined(HAVE_KQUEUE)
    const int oldMode = socket->second.first;
#endif
    socket->second.first = mode;

    int e;
#if defined(HAVE_EPOLL)
    epoll_event ev;
    memset(&ev, 0, sizeof(ev));
    ev.events = EPOLLRDHUP;
    if (!(mode & SocketLevelTriggered))
        ev.events |= EPOLLET;
    if (mode & SocketRead)
        ev.events |= EPOLLIN;
    if (mode & SocketWrite)
        ev.events |= EPOLLOUT;
    if (mode & SocketOneShot)
        ev.events |= EPOLLONESHOT;
    ev.data.fd = fd;
    e = epoll_ctl(mPollFd, EPOLL_CTL_MOD, fd, &ev);
#elif defined(HAVE_KQUEUE)
    e = 0;
    const struct { int rf; int kf; } flags[] = {
        { SocketRead, EVFILT_READ },
        { SocketWrite, EVFILT_WRITE },
        { 0, 0 }
    };
    for (int i = 0; flags[i].rf; ++i) {
        if (!(mode & flags[i].rf) && !(oldMode & flags[i].rf))
            continue;
        struct kevent ev;
        memset(&ev, '\0', sizeof(struct kevent));
        ev.ident = fd;
        if (mode & flags[i].rf) {
            ev.flags = EV_ADD|EV_ENABLE;
            if (mode & SocketOneShot)
                ev.flags |= EV_ONESHOT;
        } else {
            assert(oldMode & flags[i].rf);
            ev.flags = EV_DELETE|EV_DISABLE;
        }
        ev.filter = flags[i].kf;
        eintrwrap(e, kevent(mPollFd, &ev, 1, 0, 0, 0));
    }
#elif defined(HAVE_SELECT)
    e = 0; // fake ok
    wakeup();
#endif
    if (e == -1) {
        if (errno != EEXIST && errno != ENOENT) {
            fprintf(stderr, "Unable to register socket %d with mode %x: %d (%s)\n",
                    fd, mode, errno, Rct::strerror().constData());
            return false;
        }
    }
    return true;
}